

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

bool llvm::operator<(StringRef LHS,StringRef RHS)

{
  unsigned_long *puVar1;
  StringRef RHS_local;
  StringRef LHS_local;
  int Res;
  char *local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  LHS_local.Data = (char *)LHS.Length;
  local_38 = (char *)RHS.Length;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&LHS_local,(unsigned_long *)&local_38);
  local_28 = *puVar1;
  if (local_28 == 0) {
    local_c = 0;
  }
  else {
    local_20 = RHS.Data;
    local_18 = LHS.Data;
    local_c = memcmp(LHS.Data,RHS.Data,local_28);
  }
  if (local_c == 0) {
    if (LHS_local.Data == local_38) {
      local_2c = 0;
    }
    else {
      local_2c = 1;
      if (LHS_local.Data < local_38) {
        local_2c = -1;
      }
    }
  }
  else {
    local_2c = 1;
    if (local_c < 0) {
      local_2c = -1;
    }
  }
  return local_2c == -1;
}

Assistant:

inline bool operator<(StringRef LHS, StringRef RHS) {
    return LHS.compare(RHS) == -1;
  }